

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O2

ssize_t __thiscall LongReadsMapper::read(LongReadsMapper *this,int __fd,void *__buf,size_t __nbytes)

{
  ostream *poVar1;
  undefined4 in_register_00000034;
  ifstream *ifs;
  
  ifs = (ifstream *)CONCAT44(in_register_00000034,__fd);
  poVar1 = sdglib::OutputLog(INFO,true);
  poVar1 = std::operator<<(poVar1,"Reading long read mappings");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::istream::read((char *)ifs,(long)&this->k);
  std::istream::read((char *)ifs,(long)&this->max_index_freq);
  std::istream::read((char *)ifs,(long)&this->min_size);
  std::istream::read((char *)ifs,(long)&this->min_chain);
  std::istream::read((char *)ifs,(long)&this->max_jump);
  std::istream::read((char *)ifs,(long)&this->max_delta_change);
  sdglib::read_flat_vector<LongReadMapping>(ifs,&this->mappings);
  poVar1 = sdglib::OutputLog(INFO,true);
  poVar1 = std::operator<<(poVar1,"Updating read mapping indexes!");
  std::endl<char,std::char_traits<char>>(poVar1);
  update_indexes(this);
  poVar1 = sdglib::OutputLog(INFO,true);
  poVar1 = std::operator<<(poVar1,"Done!");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  return (ssize_t)poVar1;
}

Assistant:

void LongReadsMapper::read(std::ifstream &inf) {
    sdglib::OutputLog() << "Reading long read mappings" << std::endl;

    inf.read(reinterpret_cast<char *>(&k), sizeof(k));
    inf.read(reinterpret_cast<char *>(&max_index_freq), sizeof(max_index_freq));
    inf.read(reinterpret_cast<char *>(&min_size), sizeof(min_size));
    inf.read(reinterpret_cast<char *>(&min_chain), sizeof(min_chain));
    inf.read(reinterpret_cast<char *>(&max_jump), sizeof(max_jump));
    inf.read(reinterpret_cast<char *>(&max_delta_change), sizeof(max_delta_change));

    sdglib::read_flat_vector(inf, mappings);

    sdglib::OutputLog() << "Updating read mapping indexes!" << std::endl;
    update_indexes();
    sdglib::OutputLog() << "Done!" << std::endl;
}